

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O3

void __thiscall level_tools::reconstruct_sectors(level_tools *this)

{
  xr_custom_object_vec *this_00;
  uint32_t *puVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  uint16_t uVar5;
  int iVar6;
  xr_scene_sectors *pxVar7;
  xr_sector_object *this_01;
  int iVar8;
  pointer ppsVar9;
  int iVar10;
  pointer ppsVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  xr_name_gen name;
  xr_name_gen local_60;
  pointer local_50;
  level_tools *local_48;
  pointer local_40;
  xr_sector_object *local_38;
  
  if (this->m_level->m_sectors != (xr_level_sectors *)0x0) {
    uVar13 = 0;
    xray_re::msg("building %s","sector.part");
    pxVar7 = xray_re::xr_scene::sectors(this->m_scene);
    this_00 = &(pxVar7->super_xr_scene_objects).m_objects;
    this->m_scene_sectors = this_00;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,(long)(this->m_sectors->
                             super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_sectors->
                             super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3);
    uVar5 = get_default_sector_idx(this);
    this->m_default_sector_idx = uVar5;
    xray_re::msg("selected sector #%u (of %Iu) as default",(ulong)uVar5,
                 (long)(this->m_sectors->
                       super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_sectors->
                       super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&local_60,(EVP_PKEY_CTX *)0x1ea0ad);
    ppsVar11 = (this->m_sectors->
               super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppsVar9 = (this->m_sectors->
              super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppsVar11 != ppsVar9) {
      uVar5 = 0;
      local_50 = ppsVar9;
      local_48 = this;
      do {
        this_01 = (xr_sector_object *)operator_new(0x98);
        xray_re::xr_sector_object::xr_sector_object(this_01,this->m_scene);
        pcVar4 = local_60.m_name;
        if (uVar5 == this->m_default_sector_idx) {
          std::__cxx11::string::_M_replace
                    ((ulong)&(this_01->super_xr_custom_object).m_name,0,
                     (char *)(this_01->super_xr_custom_object).m_name._M_string_length,0x1e9f5d);
          puVar1 = &(this_01->super_xr_custom_object).m_flags;
          *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
          this_01->m_private = '\x01';
          *(undefined4 *)&(this_01->super_xr_custom_object).field_0x6c = 0x3f800000;
          fVar14 = 0.0;
          fVar15 = 0.0;
        }
        else {
          pcVar2 = (char *)(this_01->super_xr_custom_object).m_name._M_string_length;
          local_40 = ppsVar11;
          strlen(local_60.m_name);
          ppsVar11 = local_40;
          this = local_48;
          ppsVar9 = local_50;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this_01->super_xr_custom_object).m_name,0,pcVar2,(ulong)pcVar4);
          xray_re::xr_name_gen::next(&local_60);
          this_01->m_private = '\0';
          while( true ) {
            iVar12 = (int)uVar13;
            iVar3 = (int)(uVar13 / 3);
            iVar10 = iVar12 + iVar3 * -3;
            iVar6 = (int)(uVar13 / 3) + (int)(uVar13 / 9) * -3;
            iVar8 = (int)(uVar13 / 9) + (int)(uVar13 / 0x1b) * -3;
            if ((((iVar10 != 2) || (iVar6 != 2)) || (iVar8 != 2)) &&
               ((((iVar10 != 1 || (iVar6 != 1)) || (iVar8 != 1)) &&
                ((1 < (iVar3 * -3 + iVar12) - 1U || (iVar8 != 0 || iVar6 != 0) &&
                 ((iVar8 != 0 || iVar6 != 0) || iVar10 != 0)))))) break;
            uVar13 = (ulong)(iVar12 + 1);
          }
          fVar14 = (float)iVar6 * 0.5;
          fVar15 = (float)iVar8 * 0.5;
          *(float *)&(this_01->super_xr_custom_object).field_0x6c =
               (float)(iVar12 + (int)(uVar13 / 3) * -3) * 0.5;
          uVar13 = (ulong)(iVar12 + 1);
        }
        *(float *)&this_01->field_0x70 = fVar14;
        *(float *)&this_01->field_0x74 = fVar15;
        *(undefined4 *)&this_01->field_0x78 = 0;
        local_38 = this_01;
        std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
        emplace_back<xray_re::xr_custom_object*>
                  ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                   this->m_scene_sectors,(xr_custom_object **)&local_38);
        ppsVar11 = ppsVar11 + 1;
        uVar5 = uVar5 + 1;
      } while (ppsVar11 != ppsVar9);
    }
    operator_delete(local_60.m_name,1);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sectors()
{
	if (m_level->sectors() == 0)
		return;
	msg("building %s", "sector.part");

	m_scene_sectors = &m_scene->sectors()->objects();
	m_scene_sectors->reserve(m_sectors->size());

	m_default_sector_idx = get_default_sector_idx();
	msg("selected sector #%u (of %" PRIuSIZET ") as default", m_default_sector_idx, m_sectors->size());

	uint16_t sector_idx = 0;
	unsigned seed = 0;
	xr_name_gen name("sector");
	for (sector_data_vec_cit it = m_sectors->begin(),
			end = m_sectors->end(); it != end; ++it, ++sector_idx) {
		xr_sector_object* new_sector = new xr_sector_object(*m_scene);
		if (sector_idx == m_default_sector_idx) {
			new_sector->co_name() = "Sector_DEFAULT";
			new_sector->co_flags() &= ~COF_VISIBLE;
			new_sector->priv() = true;
			new_sector->color().set(1.f, 0, 0, 0);
		} else {
			new_sector->co_name() = name.get();
			name.next();
			new_sector->priv() = false;
			unsigned r, g, b;
			do {
				r = seed%3;
				g = (seed/3)%3;
				b = (seed/9)%3;
				++seed;
			} while (invalid_sector_color(r, g, b));
			new_sector->color().set(r*0.5f, g*0.5f, b*0.5f);
		}
		m_scene_sectors->push_back(new_sector);
	}
}